

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall
QPDF::getLinearizedParts
          (QPDF *this,ObjTable *obj,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part4,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part6,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part7,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part8,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part9)

{
  calculateLinearizationData<QPDFWriter::ObjTable>(this,obj);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            (part4,&((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->part4);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            (part6,&((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->part6);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            (part7,&((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->part7);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            (part8,&((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->part8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            (part9,&((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->part9);
  return;
}

Assistant:

void
QPDF::getLinearizedParts(
    QPDFWriter::ObjTable const& obj,
    std::vector<QPDFObjectHandle>& part4,
    std::vector<QPDFObjectHandle>& part6,
    std::vector<QPDFObjectHandle>& part7,
    std::vector<QPDFObjectHandle>& part8,
    std::vector<QPDFObjectHandle>& part9)
{
    calculateLinearizationData(obj);
    part4 = m->part4;
    part6 = m->part6;
    part7 = m->part7;
    part8 = m->part8;
    part9 = m->part9;
}